

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

bool __thiscall MeCab::Viterbi::viterbi<true,false>(Viterbi *this,Lattice *lattice)

{
  Tokenizer<mecab_node_t,_mecab_path_t> *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  Connector *connector;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  mecab_node_t *pmVar6;
  undefined4 extraout_var_05;
  mecab_node_t *pmVar7;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long pos_1;
  size_t pos_00;
  Allocator<mecab_node_t,_mecab_path_t> *in_R9;
  size_t pos;
  size_t pos_01;
  Node **begin_node_list;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar3 = (*lattice->_vptr_Lattice[5])(lattice);
  begin_node_list = (Node **)CONCAT44(extraout_var,iVar3);
  iVar3 = (*lattice->_vptr_Lattice[4])(lattice);
  lVar5 = CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*lattice->_vptr_Lattice[0x16])(lattice);
  connector = (Connector *)CONCAT44(extraout_var_01,iVar3);
  iVar3 = (*lattice->_vptr_Lattice[0xb])(lattice);
  pos_00 = CONCAT44(extraout_var_02,iVar3);
  iVar3 = (*lattice->_vptr_Lattice[8])(lattice);
  pTVar1 = (this->tokenizer_).ptr_;
  iVar4 = (*lattice->_vptr_Lattice[0x16])(lattice);
  pmVar6 = Tokenizer<mecab_node_t,_mecab_path_t>::getBOSNode
                     (pTVar1,(Allocator<mecab_node_t,_mecab_path_t> *)
                             CONCAT44(extraout_var_04,iVar4));
  iVar4 = (*lattice->_vptr_Lattice[8])(lattice);
  pmVar6->surface = (char *)CONCAT44(extraout_var_05,iVar4);
  *begin_node_list = pmVar6;
  for (pos_01 = 0; pos_00 != pos_01; pos_01 = pos_01 + 1) {
    if (begin_node_list[pos_01] != (Node *)0x0) {
      pmVar7 = Tokenizer<mecab_node_t,_mecab_path_t>::lookup<false>
                         ((this->tokenizer_).ptr_,(char *)(CONCAT44(extraout_var_03,iVar3) + pos_01)
                          ,(char *)(CONCAT44(extraout_var_03,iVar3) + pos_00),
                          (Allocator<mecab_node_t,_mecab_path_t> *)connector,lattice);
      *(mecab_node_t **)(lVar5 + pos_01 * 8) = pmVar7;
      bVar2 = anon_unknown_20::connect<true>
                        (pos_01,pmVar7,begin_node_list,(Node **)(this->connector_).ptr_,connector,
                         in_R9);
      if (!bVar2) goto LAB_001298d2;
    }
  }
  pTVar1 = (this->tokenizer_).ptr_;
  iVar3 = (*lattice->_vptr_Lattice[0x16])(lattice);
  pmVar7 = Tokenizer<mecab_node_t,_mecab_path_t>::getEOSNode
                     (pTVar1,(Allocator<mecab_node_t,_mecab_path_t> *)
                             CONCAT44(extraout_var_06,iVar3));
  iVar3 = (*lattice->_vptr_Lattice[8])(lattice);
  iVar4 = (*lattice->_vptr_Lattice[0xb])(lattice);
  pmVar7->surface = (char *)(CONCAT44(extraout_var_08,iVar4) + CONCAT44(extraout_var_07,iVar3));
  iVar3 = (*lattice->_vptr_Lattice[0xb])(lattice);
  *(mecab_node_t **)(lVar5 + CONCAT44(extraout_var_09,iVar3) * 8) = pmVar7;
  do {
    if ((long)pos_00 < 0) {
LAB_001298b4:
      *begin_node_list = pmVar6;
      iVar3 = (*lattice->_vptr_Lattice[0xb])(lattice);
      *(mecab_node_t **)(lVar5 + CONCAT44(extraout_var_10,iVar3) * 8) = pmVar7;
      return true;
    }
    if (begin_node_list[pos_00] != (Node *)0x0) {
      bVar2 = anon_unknown_20::connect<true>
                        (pos_00,pmVar7,begin_node_list,(Node **)(this->connector_).ptr_,connector,
                         in_R9);
      if (!bVar2) {
LAB_001298d2:
        (*lattice->_vptr_Lattice[0x25])(lattice,"too long sentence.");
        return false;
      }
      goto LAB_001298b4;
    }
    pos_00 = pos_00 - 1;
  } while( true );
}

Assistant:

bool Viterbi::viterbi(Lattice *lattice) const {
  Node **end_node_list   = lattice->end_nodes();
  Node **begin_node_list = lattice->begin_nodes();
  Allocator<Node, Path> *allocator = lattice->allocator();
  const size_t len = lattice->size();
  const char *begin = lattice->sentence();
  const char *end = begin + len;

  Node *bos_node = tokenizer_->getBOSNode(lattice->allocator());
  bos_node->surface = lattice->sentence();
  end_node_list[0] = bos_node;

  for (size_t pos = 0; pos < len; ++pos) {
    if (end_node_list[pos]) {
      Node *right_node = tokenizer_->lookup<IsPartial>(begin + pos, end,
                                                       allocator, lattice);
      begin_node_list[pos] = right_node;
      if (!connect<IsAllPath>(pos, right_node,
                              begin_node_list,
                              end_node_list,
                              connector_.get(),
                              allocator)) {
        lattice->set_what("too long sentence.");
        return false;
      }
}
}

  Node *eos_node = tokenizer_->getEOSNode(lattice->allocator());
  eos_node->surface = lattice->sentence() + lattice->size();
  begin_node_list[lattice->size()] = eos_node;

  for (long pos = len; static_cast<long>(pos) >= 0; --pos) {
    if (end_node_list[pos]) {
      if (!connect<IsAllPath>(pos, eos_node,
                              begin_node_list,
                              end_node_list,
                              connector_.get(),
                              allocator)) {
        lattice->set_what("too long sentence.");
        return false;
      }
      break;
    }
  }

  end_node_list[0] = bos_node;
  begin_node_list[lattice->size()] = eos_node;

  return true;
}